

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

State __thiscall QAccessibleMdiSubWindow::state(QAccessibleMdiSubWindow *this)

{
  bool bVar1;
  char cVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  long lVar5;
  uint uVar6;
  State SVar7;
  long in_FS_OFFSET;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  bVar1 = QWidget::isMaximized(pQVar3);
  uVar6 = 0x180004;
  if (bVar1) {
    uVar6 = 4;
  }
  pQVar3 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar4 = QApplication::focusWidget();
  bVar1 = QWidget::isAncestorOf(pQVar3,pQVar4);
  if (!bVar1) {
    pQVar3 = QApplication::focusWidget();
    pQVar4 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    if (pQVar3 != pQVar4) goto LAB_004d2175;
  }
  uVar6 = uVar6 | 8;
LAB_004d2175:
  lVar5 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  uVar6 = (~*(uint *)(*(long *)(lVar5 + 0x20) + 8) & 0x8000) << 2 | uVar6;
  lVar5 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar3 = *(QWidget **)(*(long *)(lVar5 + 8) + 0x10);
  if (pQVar3 != (QWidget *)0x0) {
    local_38 = QWidget::contentsRect(pQVar3);
    lVar5 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    cVar2 = QRect::contains(&local_38,(bool)((char)*(undefined8 *)(lVar5 + 0x20) + '\x14'));
    if (cVar2 == '\0') {
      uVar6 = uVar6 | 0x40000;
    }
  }
  lVar5 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    SVar7._0_4_ = uVar6 | *(uint *)(*(long *)(lVar5 + 0x20) + 8) & 1;
    SVar7._4_4_ = 0;
    return SVar7;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::State QAccessibleMdiSubWindow::state() const
{
    QAccessible::State state;
    state.focusable = true;
    if (!mdiSubWindow()->isMaximized()) {
        state.movable = true;
        state.sizeable = true;
    }
    if (mdiSubWindow()->isAncestorOf(QApplication::focusWidget())
            || QApplication::focusWidget() == mdiSubWindow())
        state.focused = true;
    if (!mdiSubWindow()->isVisible())
        state.invisible = true;
    if (const QWidget *parent = mdiSubWindow()->parentWidget())
        if (!parent->contentsRect().contains(mdiSubWindow()->geometry()))
            state.offscreen = true;
    if (!mdiSubWindow()->isEnabled())
        state.disabled = true;
    return state;
}